

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

void __thiscall QScrollArea::setWidget(QScrollArea *this,QWidget *widget)

{
  bool bVar1;
  QScrollAreaPrivate *this_00;
  QWidget *this_01;
  QWidget *pQVar2;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QScrollAreaPrivate *d;
  QScrollAreaPrivate *in_stack_00000050;
  QWidget *in_stack_ffffffffffffffb8;
  QWidget **in_stack_ffffffffffffffc0;
  undefined1 enabled;
  QWidget *pQVar3;
  QSize in_stack_ffffffffffffffe0;
  QWidget *this_02;
  
  this_02 = *(QWidget **)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QScrollArea *)0x6794cf);
  bVar1 = ::operator==(in_stack_ffffffffffffffc0,(QPointer<QWidget> *)in_stack_ffffffffffffffb8);
  if ((!bVar1) && (in_RSI != (QWidget *)0x0)) {
    this_01 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x67950c);
    if (this_01 != (QWidget *)0x0) {
      (**(code **)(*(long *)this_01 + 0x20))();
    }
    QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffffb8);
    QAbstractSlider::setValue((QAbstractSlider *)pQVar3,(int)((ulong)this_00 >> 0x20));
    QAbstractSlider::setValue((QAbstractSlider *)pQVar3,(int)((ulong)this_00 >> 0x20));
    pQVar2 = QWidget::parentWidget((QWidget *)0x679567);
    if (pQVar2 != (this_00->super_QAbstractScrollAreaPrivate).viewport) {
      QWidget::setParent((QWidget *)in_stack_ffffffffffffffe0,pQVar3);
    }
    bVar1 = QWidget::testAttribute(in_RDI,(WidgetAttribute)((ulong)this_01 >> 0x20));
    enabled = (undefined1)((ulong)in_RDI >> 0x38);
    pQVar3 = in_RSI;
    if (!bVar1) {
      (**(code **)(*(long *)in_RSI + 0x70))();
      QWidget::resize(this_02,(QSize *)pQVar3);
      in_stack_ffffffffffffffb8 = in_RSI;
    }
    QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffffb8);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6795ec);
    QWidget::setAutoFillBackground((QWidget *)this_00,(bool)enabled);
    QObject::installEventFilter(&pQVar3->super_QObject);
    QSize::QSize((QSize *)this_01);
    this_00->widgetSize = in_stack_ffffffffffffffe0;
    QScrollAreaPrivate::updateScrollBars(in_stack_00000050);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x67963e);
    QWidget::show((QWidget *)this_00);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollArea::setWidget(QWidget *widget)
{
    Q_D(QScrollArea);
    if (widget == d->widget || !widget)
        return;

    delete d->widget;
    d->widget = nullptr;
    d->hbar->setValue(0);
    d->vbar->setValue(0);
    if (widget->parentWidget() != d->viewport)
        widget->setParent(d->viewport);
    if (!widget->testAttribute(Qt::WA_Resized))
        widget->resize(widget->sizeHint());
    d->widget = widget;
    d->widget->setAutoFillBackground(true);
    widget->installEventFilter(this);
    d->widgetSize = QSize();
    d->updateScrollBars();
    d->widget->show();

}